

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  bool bVar4;
  FuncType func_type;
  TableType table_type;
  FuncType local_128;
  TableType local_e8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x11,loc);
  local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.limits.max._0_3_ = 0;
  local_e8.limits._11_8_ = 0;
  local_e8.element.enum_ = Any;
  local_e8.element.type_index_ = 0;
  local_e8.limits.initial._0_3_ = 0;
  local_e8.limits.initial._3_5_ = 0;
  Var::Var(&local_78,sig_var);
  RVar2 = CheckFuncTypeIndex(this,&local_78,&local_128);
  Var::~Var(&local_78);
  Var::Var(&local_c0,table_var);
  RVar3 = CheckTableIndex(this,&local_c0,&local_e8);
  bVar4 = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  Var::~Var(&local_c0);
  if (local_e8.element.enum_ != FuncRef) {
    RVar1 = PrintError(this,loc,"type mismatch: call_indirect must reference table of funcref type")
    ;
    bVar4 = bVar4 || RVar1.enum_ == Error;
  }
  RVar1 = TypeChecker::OnCallIndirect
                    (&this->typechecker_,&local_128.params,&local_128.results,&local_e8.limits);
  if (local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar4 | RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnCallIndirect(const Location& loc,
                                       Var sig_var,
                                       Var table_var) {
  Result result = CheckInstr(Opcode::CallIndirect, loc);
  FuncType func_type;
  TableType table_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |= CheckTableIndex(table_var, &table_type);
  if (table_type.element != Type::FuncRef) {
    result |= PrintError(
        loc,
        "type mismatch: call_indirect must reference table of funcref type");
  }
  result |= typechecker_.OnCallIndirect(func_type.params, func_type.results,
                                        table_type.limits);
  return result;
}